

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

void __thiscall Minisat::SimpSolver::relocAll(SimpSolver *this,ClauseAllocator *to)

{
  int iVar1;
  Size SVar2;
  uint32_t uVar3;
  vec<unsigned_int,_int> *this_00;
  Clause *this_01;
  OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
  *in_RSI;
  Solver *in_RDI;
  Queue<unsigned_int> *unaff_retaddr;
  CRef cr;
  int i_1;
  int j;
  vec<unsigned_int,_int> *cs;
  int i;
  ClauseAllocator *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  int local_28;
  int local_24;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar4;
  int iVar5;
  Solver *pSVar6;
  
  if ((in_RDI[1].conflict.super_IntSet<Minisat::Lit,_Minisat::MkIndexLit>.in_set.map.cap & 1) != 0)
  {
    iVar4 = 0;
    pSVar6 = in_RDI;
    while (iVar5 = iVar4, iVar1 = Solver::nVars(in_RDI), iVar4 < iVar1) {
      OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
      ::clean(in_RSI,(int *)CONCAT44(iVar5,in_stack_ffffffffffffffe8));
      this_00 = OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
                ::operator[]((OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
                              *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                             (int *)in_stack_ffffffffffffffb8);
      local_24 = 0;
      while (in_stack_ffffffffffffffc0 = local_24, SVar2 = vec<unsigned_int,_int>::size(this_00),
            in_stack_ffffffffffffffc0 < SVar2) {
        in_stack_ffffffffffffffb8 = &in_RDI->ca;
        vec<unsigned_int,_int>::operator[](this_00,local_24);
        ClauseAllocator::reloc
                  ((ClauseAllocator *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (CRef *)in_RDI,(ClauseAllocator *)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
        local_24 = local_24 + 1;
      }
      iVar4 = iVar5 + 1;
    }
    for (local_28 = Queue<unsigned_int>::size
                              ((Queue<unsigned_int> *)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
        0 < local_28; local_28 = local_28 + -1) {
      in_stack_ffffffffffffffd4 = Queue<unsigned_int>::peek((Queue<unsigned_int> *)0xa44181);
      Queue<unsigned_int>::pop((Queue<unsigned_int> *)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
      this_01 = ClauseAllocator::operator[]
                          ((ClauseAllocator *)CONCAT44(iVar4,in_stack_ffffffffffffffc0),
                           (CRef)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      uVar3 = Clause::mark(this_01);
      if (uVar3 == 0) {
        ClauseAllocator::reloc
                  ((ClauseAllocator *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (CRef *)in_RDI,(ClauseAllocator *)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
        Queue<unsigned_int>::insert(unaff_retaddr,(uint)((ulong)pSVar6 >> 0x20));
      }
    }
    ClauseAllocator::reloc
              ((ClauseAllocator *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (CRef *)in_RDI,(ClauseAllocator *)CONCAT44(iVar4,in_stack_ffffffffffffffc0));
  }
  return;
}

Assistant:

void SimpSolver::relocAll(ClauseAllocator& to)
{
    if (!use_simplification) return;

    // All occurs lists:
    //
    for (int i = 0; i < nVars(); i++){
        occurs.clean(i);
        vec<CRef>& cs = occurs[i];
        for (int j = 0; j < cs.size(); j++)
            ca.reloc(cs[j], to);
    }

    // Subsumption queue:
    //
    for (int i = subsumption_queue.size(); i > 0; i--){
        CRef cr = subsumption_queue.peek(); subsumption_queue.pop();
        if (ca[cr].mark()) continue;
        ca.reloc(cr, to);
        subsumption_queue.insert(cr);
    }
        
    // Temporary clause:
    //
    ca.reloc(bwdsub_tmpunit, to);
}